

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

bool lsvm::string::equals(string *s1,string *s2)

{
  char cVar1;
  string *psVar2;
  char *pcVar3;
  
  if ((s1->size == s2->size) && (s1->count == s2->count)) {
    psVar2 = s2 + 1;
    cVar1 = (char)s1[1].count;
    if (cVar1 != '\0') {
      pcVar3 = (char *)((long)&s1[1].count + 1);
      do {
        if (cVar1 != (char)psVar2->count) {
          return false;
        }
        psVar2 = (string *)((long)&psVar2->count + 1);
        cVar1 = *pcVar3;
        pcVar3 = pcVar3 + 1;
      } while (cVar1 != '\0');
    }
    return (char)psVar2->count == '\0';
  }
  return false;
}

Assistant:

bool equals(string* s1, string* s2){
    if(s1->size != s2->size || s1->count != s2->count)
        return false;

    char* s1p = c_str(s1);
    char* s2p = c_str(s2);

    while(*s1p != '\0'){
        if(*s1p != *s2p)
            return false;
        ++s1p; ++s2p;
    }

    return *s2p == '\0' && *s1p == *s2p;
}